

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall
ON_Xform::GetKMLOrientationAnglesDegrees
          (ON_Xform *this,double *heading_degrees,double *tilt_degrees,double *roll_degrees)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 extraout_EAX;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double __x;
  double roll_radians;
  double tilt_radians;
  double heading_radians;
  double local_48;
  double local_40;
  double local_38;
  
  local_38 = ON_DBL_QNAN;
  local_40 = ON_DBL_QNAN;
  local_48 = ON_DBL_QNAN;
  bVar2 = GetKMLOrientationAnglesRadians(this,&local_38,&local_40,&local_48);
  dVar6 = local_38 * 57.29577951308232;
  dVar7 = floor(dVar6);
  uVar4 = -(ulong)(0.5 < dVar6 - dVar7);
  dVar7 = (double)(~uVar4 & (ulong)dVar7 | (ulong)(dVar7 + 1.0) & uVar4);
  uVar4 = -(ulong)(ABS(dVar6 - dVar7) < 0.0001388888888888889);
  dVar6 = (double)(~uVar4 & (ulong)dVar6 | uVar4 & (ulong)dVar7);
  dVar6 = (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
                  (ulong)(dVar6 + 360.0) & -(ulong)(dVar6 < 0.0));
  *heading_degrees = (double)(~-(ulong)(ABS(dVar6) < 0.0001388888888888889) & (ulong)dVar6);
  dVar6 = local_48 * 57.29577951308232;
  __x = local_40 * 57.29577951308232;
  dVar7 = floor(dVar6);
  dVar8 = floor(__x);
  uVar4 = -(ulong)(0.5 < dVar6 - dVar7);
  uVar5 = -(ulong)(0.5 < __x - dVar8);
  dVar7 = (double)((ulong)(dVar7 + 1.0) & uVar4 | ~uVar4 & (ulong)dVar7);
  dVar8 = (double)((ulong)(dVar8 + 1.0) & uVar5 | ~uVar5 & (ulong)dVar8);
  uVar4 = -(ulong)(ABS(dVar6 - dVar7) < 0.0001388888888888889);
  uVar5 = -(ulong)(ABS(__x - dVar8) < 0.0001388888888888889);
  dVar7 = (double)(~uVar4 & (ulong)dVar6 | (ulong)dVar7 & uVar4);
  dVar6 = (double)(~uVar5 & (ulong)__x | (ulong)dVar8 & uVar5);
  auVar1._8_8_ = -(ulong)(dVar6 < -180.0);
  auVar1._0_8_ = -(ulong)(dVar7 < -180.0);
  uVar3 = movmskpd(extraout_EAX,auVar1);
  if ((uVar3 & 2) != 0) {
    dVar6 = dVar6 + 360.0;
  }
  *tilt_degrees = (double)(~-(ulong)(ABS(dVar6) < 0.0001388888888888889) & (ulong)dVar6);
  if ((uVar3 & 1) != 0) {
    dVar7 = dVar7 + 360.0;
  }
  *roll_degrees = (double)(~-(ulong)(ABS(dVar7) < 0.0001388888888888889) & (ulong)dVar7);
  return bVar2;
}

Assistant:

bool ON_Xform::GetKMLOrientationAnglesDegrees(double& heading_degrees, double& tilt_degrees, double& roll_degrees) const
{
  double heading_radians = ON_DBL_QNAN;
  double tilt_radians = ON_DBL_QNAN;
  double roll_radians = ON_DBL_QNAN;
  const bool rc = ON_Xform::GetKMLOrientationAnglesRadians(heading_radians, tilt_radians, roll_radians);
  heading_degrees = Internal_RadiansToPrettyKMLDegrees(heading_radians, 0.0);
  tilt_degrees = Internal_RadiansToPrettyKMLDegrees(tilt_radians, -180.0);
  roll_degrees = Internal_RadiansToPrettyKMLDegrees(roll_radians, -180.0);
  return rc;
}